

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  cmMakefile *pcVar1;
  bool bVar2;
  byte bVar3;
  string *psVar4;
  cmGlobalGenerator *this_00;
  LocalGeneratorVector *this_01;
  const_reference this_02;
  char *pcVar5;
  ostream *poVar6;
  pointer pcVar7;
  undefined8 in_R8;
  string_view str;
  undefined1 auVar8 [16];
  string local_520;
  string_view local_500;
  string local_4f0;
  cmAlphaNum local_4d0;
  cmAlphaNum local_4a0;
  undefined1 local_470 [8];
  string remove;
  string local_440;
  string local_420;
  undefined1 local_400 [8];
  string fc;
  string *cfl;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_3a0 [8];
  ofstream fout;
  cmAlphaNum local_170;
  undefined1 local_140 [8];
  string cleanfile;
  string *currentBinaryDir;
  value_type *rootLG;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  string local_a0;
  string_view local_80;
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  cmValue prop_value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cleanFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&prop_value);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"ADDITIONAL_CLEAN_FILES",&local_59);
  local_38 = cmMakefile::GetProperty(pcVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar2 = cmValue::operator_cast_to_bool(&local_38);
  if (bVar2) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_38);
    std::__cxx11::string::string((string *)&local_c0,(string *)psVar4);
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"CMAKE_BUILD_TYPE",&local_e1);
    psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_e0);
    std::__cxx11::string::string((string *)&local_108);
    in_R8 = 0;
    cmGeneratorExpression::Evaluate
              (&local_a0,&local_c0,(cmLocalGenerator *)this,psVar4,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_108);
    local_80 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a0);
    cmExpandList(local_80,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&prop_value,false);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&prop_value);
  if (!bVar2) {
    this_00 = cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)this);
    this_01 = cmGlobalGenerator::GetLocalGenerators(this_00);
    this_02 = std::
              vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
              ::at(this_01,0);
    cleanfile.field_2._8_8_ =
         cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    cmAlphaNum::cmAlphaNum(&local_170,(string *)cleanfile.field_2._8_8_);
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)&fout.field_0x1f8,"/CMakeFiles/cmake_directory_clean.cmake");
    cmStrCat<>((string *)local_140,&local_170,(cmAlphaNum *)&fout.field_0x1f8);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_3a0,pcVar5,_S_out);
    bVar3 = std::ios::operator!((ios *)(local_3a0 + (long)*(_func_int **)((long)local_3a0 + -0x18)))
    ;
    if ((bVar3 & 1) == 0) {
      std::operator<<((ostream *)local_3a0,"file(REMOVE_RECURSE\n");
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&prop_value);
      cfl = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&prop_value);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&cfl);
        if (!bVar2) break;
        fc.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
        pcVar7 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                 operator->(this_02);
        cmsys::SystemTools::CollapseFullPath
                  (&local_420,(string *)fc.field_2._8_8_,(string *)cleanfile.field_2._8_8_);
        cmOutputConverter::MaybeRelativeToCurBinDir
                  ((string *)local_400,&pcVar7->super_cmOutputConverter,&local_420);
        std::__cxx11::string::~string((string *)&local_420);
        poVar6 = std::operator<<((ostream *)local_3a0,"  ");
        auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_400);
        str._M_len = auVar8._8_8_;
        remove.field_2._8_8_ = auVar8._0_8_;
        str._M_str = (char *)0x0;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_440,(cmOutputConverter *)remove.field_2._8_8_,str,(WrapQuotes)in_R8);
        poVar6 = std::operator<<(poVar6,(string *)&local_440);
        std::operator<<(poVar6,"\n");
        std::__cxx11::string::~string((string *)&local_440);
        std::__cxx11::string::~string((string *)local_400);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      std::operator<<((ostream *)local_3a0,")\n");
      bVar2 = false;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     "Could not create ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140)
      ;
      cmSystemTools::Error((string *)&__range1);
      std::__cxx11::string::~string((string *)&__range1);
      bVar2 = true;
    }
    std::ofstream::~ofstream(local_3a0);
    if (!bVar2) {
      cmAlphaNum::cmAlphaNum(&local_4a0,"$(CMAKE_COMMAND) -P ");
      pcVar7 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                         (this_02);
      cmOutputConverter::MaybeRelativeToCurBinDir
                (&local_520,&pcVar7->super_cmOutputConverter,(string *)local_140);
      local_500 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_520);
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_4f0,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,local_500,SHELL);
      cmAlphaNum::cmAlphaNum(&local_4d0,&local_4f0);
      cmStrCat<>((string *)local_470,&local_4a0,&local_4d0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_520);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(commands,(value_type *)local_470);
      std::__cxx11::string::~string((string *)local_470);
    }
    std::__cxx11::string::~string((string *)local_140);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&prop_value);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand(
  std::vector<std::string>& commands)
{
  std::vector<std::string> cleanFiles;
  // Look for additional files registered for cleaning in this directory.
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    cmExpandList(cmGeneratorExpression::Evaluate(
                   *prop_value, this,
                   this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE")),
                 cleanFiles);
  }
  if (cleanFiles.empty()) {
    return;
  }

  const auto& rootLG = this->GetGlobalGenerator()->GetLocalGenerators().at(0);
  std::string const& currentBinaryDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile =
    cmStrCat(currentBinaryDir, "/CMakeFiles/cmake_directory_clean.cmake");
  // Write clean script
  {
    cmsys::ofstream fout(cleanfile.c_str());
    if (!fout) {
      cmSystemTools::Error("Could not create " + cleanfile);
      return;
    }
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& cfl : cleanFiles) {
      std::string fc = rootLG->MaybeRelativeToCurBinDir(
        cmSystemTools::CollapseFullPath(cfl, currentBinaryDir));
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  // Create command
  {
    std::string remove = cmStrCat(
      "$(CMAKE_COMMAND) -P ",
      this->ConvertToOutputFormat(rootLG->MaybeRelativeToCurBinDir(cleanfile),
                                  cmOutputConverter::SHELL));
    commands.push_back(std::move(remove));
  }
}